

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O3

idx_t duckdb::SelectNotNull
                (Vector *left,Vector *right,idx_t count,SelectionVector *sel,
                SelectionVector *maybe_vec,OptionalSelection *false_opt,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  sel_t *psVar1;
  sel_t *psVar2;
  SelectionVector *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  optional_ptr<duckdb::ValidityMask,_true> oVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  ulong uVar12;
  idx_t iVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  sel_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong count_00;
  SelectionVector slicer;
  UnifiedVectorFormat rvdata;
  UnifiedVectorFormat lvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_128;
  OptionalSelection *local_120;
  SelectionVector *local_118;
  SelectionVector *local_110;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  Vector *local_f0;
  Vector *local_e8;
  SelectionVector local_e0;
  _Head_base<0UL,_unsigned_long_*,_false> local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_128 = (optional_ptr<duckdb::ValidityMask,_true>)
              (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
  local_120 = false_opt;
  local_118 = maybe_vec;
  local_110 = sel;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,count,&local_78);
  Vector::ToUnifiedFormat(right,count,&local_c0);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0 &&
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count == 0) {
      count = 0;
    }
    else {
      psVar1 = local_110->sel_vector;
      psVar2 = local_118->sel_vector;
      iVar13 = 0;
      do {
        sVar15 = (sel_t)iVar13;
        if (psVar1 != (sel_t *)0x0) {
          sVar15 = psVar1[iVar13];
        }
        psVar2[iVar13] = sVar15;
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
  }
  else {
    SelectionVector::SelectionVector(&local_e0,count);
    local_f0 = right;
    local_e8 = left;
    if (count == 0) {
      lVar17 = 0;
      count_00 = 0;
    }
    else {
      uVar16 = 0;
      count_00 = 0;
      lVar17 = 0;
      do {
        uVar14 = uVar16;
        if (local_110->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)local_110->sel_vector[uVar16];
        }
        uVar9 = uVar16;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(local_78.sel)->sel_vector[uVar16];
        }
        uVar12 = uVar16;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)(local_c0.sel)->sel_vector[uVar16];
        }
        if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6]
              >> (uVar9 & 0x3f) & 1) != 0)) &&
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0 ||
            ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
          local_e0.sel_vector[count_00] = (sel_t)uVar16;
          local_118->sel_vector[count_00] = (sel_t)uVar14;
          count_00 = count_00 + 1;
        }
        else {
          if (local_128.ptr != (ValidityMask *)0x0) {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_128);
            oVar6.ptr = local_128.ptr;
            _Var11._M_head_impl =
                 ((local_128.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (_Var11._M_head_impl == (unsigned_long *)0x0) {
              local_c8._M_head_impl =
                   (unsigned_long *)
                   ((local_128.ptr)->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,(unsigned_long *)&local_c8);
              p_Var8 = p_Stack_100;
              peVar7 = local_108;
              local_108 = (element_type *)0x0;
              p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var4 = ((oVar6.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              ((oVar6.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar7;
              ((oVar6.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var8;
              if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                 p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
              }
              pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&((oVar6.ptr)->super_TemplatedValidityMask<unsigned_long>).
                                    validity_data);
              _Var11._M_head_impl =
                   (pTVar10->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              ((oVar6.ptr)->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   _Var11._M_head_impl;
            }
            bVar5 = (byte)uVar14 & 0x3f;
            _Var11._M_head_impl[uVar14 >> 6] =
                 _Var11._M_head_impl[uVar14 >> 6] &
                 (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          }
          if (local_120->sel != (SelectionVector *)0x0) {
            local_120->sel->sel_vector[lVar17] = (sel_t)uVar14;
          }
          lVar17 = lVar17 + 1;
        }
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
    pSVar3 = local_120->sel;
    if (pSVar3 != (SelectionVector *)0x0) {
      psVar1 = pSVar3->sel_vector;
      p_Var4 = (pSVar3->selection_data).internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (pSVar3->selection_data).internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pSVar3->selection_data).internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      pSVar3->sel_vector = psVar1 + lVar17;
    }
    if (count_00 < count && count_00 != 0) {
      Vector::Slice(local_e8,&local_e0,count_00);
      Vector::Slice(local_f0,&local_e0,count_00);
    }
    count = count_00;
    if (local_e0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return count;
}

Assistant:

static inline idx_t SelectNotNull(Vector &left, Vector &right, const idx_t count, const SelectionVector &sel,
                                  SelectionVector &maybe_vec, OptionalSelection &false_opt,
                                  optional_ptr<ValidityMask> null_mask) {

	UnifiedVectorFormat lvdata, rvdata;
	left.ToUnifiedFormat(count, lvdata);
	right.ToUnifiedFormat(count, rvdata);

	auto &lmask = lvdata.validity;
	auto &rmask = rvdata.validity;

	// For top-level comparisons, NULL semantics are in effect,
	// so filter out any NULLs
	idx_t remaining = 0;
	if (lmask.AllValid() && rmask.AllValid()) {
		//	None are NULL, distinguish values.
		for (idx_t i = 0; i < count; ++i) {
			const auto idx = sel.get_index(i);
			maybe_vec.set_index(remaining++, idx);
		}
		return remaining;
	}

	// Slice the Vectors down to the rows that are not determined (i.e., neither is NULL)
	SelectionVector slicer(count);
	idx_t false_count = 0;
	for (idx_t i = 0; i < count; ++i) {
		const auto result_idx = sel.get_index(i);
		const auto lidx = lvdata.sel->get_index(i);
		const auto ridx = rvdata.sel->get_index(i);
		if (!lmask.RowIsValid(lidx) || !rmask.RowIsValid(ridx)) {
			if (null_mask) {
				null_mask->SetInvalid(result_idx);
			}
			false_opt.Append(false_count, result_idx);
		} else {
			//	Neither is NULL, distinguish values.
			slicer.set_index(remaining, i);
			maybe_vec.set_index(remaining++, result_idx);
		}
	}
	false_opt.Advance(false_count);

	if (remaining && remaining < count) {
		left.Slice(slicer, remaining);
		right.Slice(slicer, remaining);
	}

	return remaining;
}